

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  byte *pbVar1;
  U32 *pUVar2;
  int *piVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  bool bVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  size_t __n;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  
  if (0xff < *maxSymbolValuePtr) {
    __assert_fail("*maxSymbolValuePtr <= 255",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3a77,
                  "size_t HIST_count_parallel_wksp(unsigned int *, unsigned int *, const void *, size_t, HIST_checkInput_e, U32 *const)"
                 );
  }
  __n = (ulong)(*maxSymbolValuePtr + 1) << 2;
  if (sourceSize == 0) {
    uVar10 = 0;
    memset(count,0,__n);
    *maxSymbolValuePtr = 0;
  }
  else {
    pbVar1 = (byte *)((long)source + sourceSize);
    memset(workSpace,0,0x1000);
    if (0x13 < (long)sourceSize) {
      pbVar8 = (byte *)((sourceSize - 0xf) + (long)source);
      uVar13 = *source;
      pbVar11 = (byte *)source;
      do {
        uVar14 = *(uint *)(pbVar11 + 4);
        workSpace[uVar13 & 0xff] = workSpace[uVar13 & 0xff] + 1;
        workSpace[(ulong)(uVar13 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar13 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar13 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar13 >> 0x18) + 0x300] = workSpace[(ulong)(uVar13 >> 0x18) + 0x300] + 1;
        uVar13 = *(uint *)(pbVar11 + 8);
        workSpace[uVar14 & 0xff] = workSpace[uVar14 & 0xff] + 1;
        workSpace[(ulong)(uVar14 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar14 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar14 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar14 >> 0x18) + 0x300] = workSpace[(ulong)(uVar14 >> 0x18) + 0x300] + 1;
        uVar14 = *(uint *)(pbVar11 + 0xc);
        workSpace[uVar13 & 0xff] = workSpace[uVar13 & 0xff] + 1;
        workSpace[(ulong)(uVar13 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar13 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar13 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar13 >> 0x18) + 0x300] = workSpace[(ulong)(uVar13 >> 0x18) + 0x300] + 1;
        uVar13 = *(uint *)(pbVar11 + 0x10);
        workSpace[uVar14 & 0xff] = workSpace[uVar14 & 0xff] + 1;
        workSpace[(ulong)(uVar14 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar14 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar14 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar14 >> 0x18) + 0x300] = workSpace[(ulong)(uVar14 >> 0x18) + 0x300] + 1;
        source = pbVar11 + 0x10;
        pbVar12 = pbVar11 + 0x14;
        pbVar11 = (byte *)source;
      } while (pbVar12 < pbVar8);
    }
    for (; source < pbVar1; source = (void *)((long)source + 1)) {
      workSpace[*source] = workSpace[*source] + 1;
    }
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
    lVar9 = 0;
    do {
      pUVar4 = workSpace + lVar9 + 0x100;
      pUVar5 = workSpace + lVar9 + 0x200;
      pUVar6 = workSpace + lVar9 + 0x300;
      pUVar2 = workSpace + lVar9;
      uVar17 = *pUVar2 + *pUVar6 + *pUVar5 + *pUVar4;
      uVar18 = pUVar2[1] + pUVar6[1] + pUVar5[1] + pUVar4[1];
      uVar19 = pUVar2[2] + pUVar6[2] + pUVar5[2] + pUVar4[2];
      uVar20 = pUVar2[3] + pUVar6[3] + pUVar5[3] + pUVar4[3];
      pUVar2 = workSpace + lVar9;
      *pUVar2 = uVar17;
      pUVar2[1] = uVar18;
      pUVar2[2] = uVar19;
      pUVar2[3] = uVar20;
      uVar13 = (uVar13 < uVar17) * uVar17 | (uVar13 >= uVar17) * uVar13;
      uVar14 = (uVar14 < uVar18) * uVar18 | (uVar14 >= uVar18) * uVar14;
      uVar15 = (uVar15 < uVar19) * uVar19 | (uVar15 >= uVar19) * uVar15;
      uVar16 = (uVar16 < uVar20) * uVar20 | (uVar16 >= uVar20) * uVar16;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x100);
    uVar13 = (uVar15 < uVar13) * uVar13 | (uVar15 >= uVar13) * uVar15;
    uVar14 = (uVar16 < uVar14) * uVar14 | (uVar16 >= uVar14) * uVar16;
    uVar10 = 0x100;
    do {
      uVar15 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar15;
    } while (workSpace[uVar10] == 0);
    if ((check == trustInput) || (uVar15 <= *maxSymbolValuePtr)) {
      *maxSymbolValuePtr = uVar15;
      memmove(count,workSpace,__n);
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
    uVar10 = 0xffffffffffffffd0;
    if (bVar7) {
      uVar10 = (ulong)((uVar14 < uVar13) * uVar13 | (uVar14 >= uVar13) * uVar14);
    }
  }
  return uVar10;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    size_t const countSize = (*maxSymbolValuePtr + 1) * sizeof(*count);
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    /* safety checks */
    assert(*maxSymbolValuePtr <= 255);
    if (!sourceSize) {
        ZSTD_memset(count, 0, countSize);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    ZSTD_memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    {   U32 s;
        for (s=0; s<256; s++) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s] > max) max = Counting1[s];
    }   }

    {   unsigned maxSymbolValue = 255;
        while (!Counting1[maxSymbolValue]) maxSymbolValue--;
        if (check && maxSymbolValue > *maxSymbolValuePtr) return ERROR(maxSymbolValue_tooSmall);
        *maxSymbolValuePtr = maxSymbolValue;
        ZSTD_memmove(count, Counting1, countSize);   /* in case count & Counting1 are overlapping */
    }
    return (size_t)max;
}